

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

char * whisper_bench_memcpy_str(int n_threads)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  int in_EDI;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  size_t i_7;
  int64_t t1_2;
  int32_t th_1;
  int32_t th;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  int64_t t0_2;
  type helper;
  double tsum_2;
  size_t i_6;
  char *dst_2;
  char *src_2;
  int32_t k;
  size_t i_5;
  int64_t t1_1;
  int64_t t0_1;
  size_t i_4;
  double tsum_1;
  size_t i_3;
  char *dst_1;
  char *src_1;
  size_t i_2;
  int64_t t1;
  int64_t t0;
  size_t i_1;
  double tsum;
  size_t i;
  char *dst;
  char *src;
  double sum;
  size_t size;
  size_t arr;
  size_t n;
  char strbuf [256];
  thread *in_stack_fffffffffffffd68;
  thread *in_stack_fffffffffffffd70;
  allocator_type *__a;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  vector<std::thread,_std::allocator<std::thread>_> *in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd9c;
  type *in_stack_fffffffffffffda0;
  type *__f;
  thread *in_stack_fffffffffffffdb0;
  int local_23c;
  int local_230;
  allocator_type local_219;
  vector<std::thread,_std::allocator<std::thread>_> local_218;
  long local_200;
  thread **local_1f8;
  uint *local_1f0;
  ulong *local_1e8;
  void **local_1e0;
  void **local_1d8;
  double local_1d0;
  thread *local_1c8;
  void *local_1c0;
  void *local_1b8;
  uint local_1ac;
  thread *local_1a8;
  long local_1a0;
  long local_198;
  ulong local_190;
  double local_188;
  thread *local_180;
  void *local_178;
  vector<std::thread,_std::allocator<std::thread>_> *local_170;
  thread *local_168;
  long local_160;
  long local_158;
  ulong local_150;
  double local_148;
  thread *local_140;
  void *local_138;
  type *local_130;
  double local_128;
  thread *local_120;
  type *local_118;
  ulong local_110;
  thread local_108 [32];
  int local_4;
  
  local_4 = in_EDI;
  if (whisper_bench_memcpy_str::s_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&whisper_bench_memcpy_str::s_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&whisper_bench_memcpy_str::s_abi_cxx11_);
      __cxa_atexit(std::__cxx11::string::~string,&whisper_bench_memcpy_str::s_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&whisper_bench_memcpy_str::s_abi_cxx11_);
    }
  }
  std::__cxx11::string::operator=((string *)&whisper_bench_memcpy_str::s_abi_cxx11_,"");
  ggml_time_init();
  local_110 = 0x14;
  if (local_4 < 1) {
    __f = (type *)(long)local_4;
  }
  else {
    __f = (type *)0x400;
  }
  auVar6._8_4_ = (int)((ulong)__f >> 0x20);
  auVar6._0_8_ = __f;
  auVar6._12_4_ = 0x45300000;
  dVar5 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)__f) - 4503599627370496.0)) * 1000000.0;
  uVar2 = (ulong)dVar5;
  local_120 = (thread *)(uVar2 | (long)(dVar5 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f);
  local_128 = 0.0;
  local_118 = __f;
  local_130 = (type *)malloc((size_t)local_120);
  local_138 = malloc((size_t)local_120);
  for (local_140 = (thread *)0x0; local_140 < local_120;
      local_140 = (thread *)((long)&(local_140->_M_id)._M_thread + 1)) {
    *(char *)((long)&(local_140->_M_id)._M_thread + (long)&local_130->size) = (char)local_140;
  }
  memcpy(local_138,local_130,(size_t)local_120);
  local_148 = 0.0;
  for (local_150 = 0; local_150 < local_110; local_150 = local_150 + 1) {
    local_158 = ggml_time_us();
    memcpy(local_138,local_130,(size_t)local_120);
    local_160 = ggml_time_us();
    local_148 = (double)(local_160 - local_158) * 1e-06 + local_148;
    iVar1 = rand();
    in_stack_fffffffffffffd9c = CONCAT13((char)(iVar1 % 0x100),(int3)in_stack_fffffffffffffd9c);
    in_stack_fffffffffffffda0 = local_130;
    iVar1 = rand();
    *(char *)((long)&in_stack_fffffffffffffda0->size + (ulong)(long)iVar1 % (ulong)local_120) =
         (char)((uint)in_stack_fffffffffffffd9c >> 0x18);
  }
  lVar3 = local_110 * (long)local_120;
  auVar7._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar7._0_8_ = lVar3;
  auVar7._12_4_ = 0x45300000;
  snprintf((char *)local_108,0x100,"memcpy: %7.2f GB/s (heat-up)\n",
           ((auVar7._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) /
           (local_148 * 1000000000.0));
  std::__cxx11::string::operator+=
            ((string *)&whisper_bench_memcpy_str::s_abi_cxx11_,(char *)local_108);
  for (local_168 = (thread *)0x0; local_168 < local_120;
      local_168 = (thread *)((long)&(local_168->_M_id)._M_thread + 1)) {
    local_128 = (double)(int)*(char *)((long)local_138 + (long)local_168) + local_128;
  }
  free(local_130);
  free(local_138);
  local_170 = (vector<std::thread,_std::allocator<std::thread>_> *)malloc((size_t)local_120);
  local_178 = malloc((size_t)local_120);
  for (local_180 = (thread *)0x0; local_180 < local_120;
      local_180 = (thread *)((long)&(local_180->_M_id)._M_thread + 1)) {
    *(char *)((long)&(local_170->super__Vector_base<std::thread,_std::allocator<std::thread>_>).
                     _M_impl.super__Vector_impl_data._M_start + (long)&(local_180->_M_id)._M_thread)
         = (char)local_180;
  }
  memcpy(local_178,local_170,(size_t)local_120);
  local_188 = 0.0;
  for (local_190 = 0; local_190 < local_110; local_190 = local_190 + 1) {
    local_198 = ggml_time_us();
    memcpy(local_178,local_170,(size_t)local_120);
    local_1a0 = ggml_time_us();
    local_188 = (double)(local_1a0 - local_198) * 1e-06 + local_188;
    iVar1 = rand();
    in_stack_fffffffffffffd8f = (undefined1)(iVar1 % 0x100);
    in_stack_fffffffffffffd90 = local_170;
    iVar1 = rand();
    *(undefined1 *)
     ((long)&(in_stack_fffffffffffffd90->
             super__Vector_base<std::thread,_std::allocator<std::thread>_>)._M_impl.
             super__Vector_impl_data._M_start + (ulong)(long)iVar1 % (ulong)local_120) =
         in_stack_fffffffffffffd8f;
  }
  lVar3 = local_110 * (long)local_120;
  auVar8._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar8._0_8_ = lVar3;
  auVar8._12_4_ = 0x45300000;
  snprintf((char *)local_108,0x100,"memcpy: %7.2f GB/s ( 1 thread)\n",
           ((auVar8._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) /
           (local_188 * 1000000000.0));
  std::__cxx11::string::operator+=
            ((string *)&whisper_bench_memcpy_str::s_abi_cxx11_,(char *)local_108);
  for (local_1a8 = (thread *)0x0; local_1a8 < local_120;
      local_1a8 = (thread *)((long)&(local_1a8->_M_id)._M_thread + 1)) {
    local_128 = (double)(int)*(char *)((long)local_178 + (long)local_1a8) + local_128;
  }
  free(local_170);
  free(local_178);
  for (local_1ac = 1; (int)local_1ac <= local_4; local_1ac = local_1ac + 1) {
    local_1b8 = malloc((size_t)local_120);
    local_1c0 = malloc((size_t)local_120);
    for (local_1c8 = (thread *)0x0; local_1c8 < local_120;
        local_1c8 = (thread *)((long)&(local_1c8->_M_id)._M_thread + 1)) {
      *(char *)((long)local_1b8 + (long)local_1c8) = (char)local_1c8;
    }
    memcpy(local_1c0,local_1b8,(size_t)local_120);
    local_1d0 = 0.0;
    local_1f8 = &local_120;
    local_1f0 = &local_1ac;
    local_1e8 = &local_110;
    local_1e0 = &local_1c0;
    local_1d8 = &local_1b8;
    local_200 = ggml_time_us();
    __a = &local_219;
    std::allocator<std::thread>::allocator((allocator<std::thread> *)0x1fff10);
    std::vector<std::thread,_std::allocator<std::thread>_>::vector
              (in_stack_fffffffffffffd90,
               CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),__a);
    std::allocator<std::thread>::~allocator((allocator<std::thread> *)0x1fff33);
    for (local_230 = 0; local_230 < (int)(local_1ac - 1); local_230 = local_230 + 1) {
      std::thread::thread<whisper_bench_memcpy_str::__0&,int&,void>
                (in_stack_fffffffffffffdb0,__f,(int *)in_stack_fffffffffffffda0);
      std::vector<std::thread,_std::allocator<std::thread>_>::operator[](&local_218,(long)local_230)
      ;
      std::thread::operator=(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      std::thread::~thread((thread *)0x1fff93);
    }
    std::
    tuple_element<0UL,_std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/src/whisper.cpp:6727:23),_int>_>
    ::type::operator()(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
    for (local_23c = 0; local_23c < (int)(local_1ac - 1); local_23c = local_23c + 1) {
      std::vector<std::thread,_std::allocator<std::thread>_>::operator[](&local_218,(long)local_23c)
      ;
      std::thread::join();
    }
    in_stack_fffffffffffffd70 = (thread *)ggml_time_us();
    local_1d0 = (double)((long)in_stack_fffffffffffffd70 - local_200) * 1e-06 + local_1d0;
    lVar3 = local_110 * (long)local_120;
    auVar9._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar9._0_8_ = lVar3;
    auVar9._12_4_ = 0x45300000;
    in_stack_fffffffffffffd68 = local_108;
    snprintf((char *)in_stack_fffffffffffffd68,0x100,"memcpy: %7.2f GB/s (%2d thread)\n",
             ((auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) /
             (local_1d0 * 1000000000.0),(ulong)local_1ac);
    std::__cxx11::string::operator+=
              ((string *)&whisper_bench_memcpy_str::s_abi_cxx11_,(char *)in_stack_fffffffffffffd68);
    for (in_stack_fffffffffffffdb0 = (thread *)0x0; in_stack_fffffffffffffdb0 < local_120;
        in_stack_fffffffffffffdb0 =
             (thread *)((long)&(in_stack_fffffffffffffdb0->_M_id)._M_thread + 1)) {
      local_128 = (double)(int)*(char *)((long)local_1c0 + (long)in_stack_fffffffffffffdb0) +
                  local_128;
    }
    free(local_1b8);
    free(local_1c0);
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)__a);
  }
  snprintf((char *)local_108,0x100,"sum:    %f\n",local_128);
  std::__cxx11::string::operator+=
            ((string *)&whisper_bench_memcpy_str::s_abi_cxx11_,(char *)local_108);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  return pcVar4;
}

Assistant:

WHISPER_API const char * whisper_bench_memcpy_str(int n_threads) {
    static std::string s;
    s = "";
    char strbuf[256];

    ggml_time_init();

    size_t n    = 20;
    size_t arr  = n_threads > 0 ? 1024llu : n_threads; // trick to avoid compiler optimizations

    // 1GB array
    const size_t size = arr*1e6;

    double sum  = 0.0;

    // heat-up
    {
        char * src = (char *) malloc(size);
        char * dst = (char *) malloc(size);

        for (size_t i = 0; i < size; i++) src[i] = i;

        memcpy(dst, src, size); // heat-up

        double tsum = 0.0;

        for (size_t i = 0; i < n; i++) {
            const int64_t t0 = ggml_time_us();

            memcpy(dst, src, size);

            const int64_t t1 = ggml_time_us();

            tsum += (t1 - t0)*1e-6;

            src[rand() % size] = rand() % 256;
        }

        snprintf(strbuf, sizeof(strbuf), "memcpy: %7.2f GB/s (heat-up)\n", (double) (n*size)/(tsum*1e9));
        s += strbuf;

        // needed to prevent the compiler from optimizing the memcpy away
        {
            for (size_t i = 0; i < size; i++) sum += dst[i];
        }

        free(src);
        free(dst);
    }

    // single-thread
    {
        char * src = (char *) malloc(size);
        char * dst = (char *) malloc(size);

        for (size_t i = 0; i < size; i++) src[i] = i;

        memcpy(dst, src, size); // heat-up

        double tsum = 0.0;

        for (size_t i = 0; i < n; i++) {
            const int64_t t0 = ggml_time_us();

            memcpy(dst, src, size);

            const int64_t t1 = ggml_time_us();

            tsum += (t1 - t0)*1e-6;

            src[rand() % size] = rand() % 256;
        }

        snprintf(strbuf, sizeof(strbuf), "memcpy: %7.2f GB/s ( 1 thread)\n", (double) (n*size)/(tsum*1e9));
        s += strbuf;

        // needed to prevent the compiler from optimizing the memcpy away
        {
            for (size_t i = 0; i < size; i++) sum += dst[i];
        }

        free(src);
        free(dst);
    }

    // multi-thread

    for (int32_t k = 1; k <= n_threads; k++) {
        char * src = (char *) malloc(size);
        char * dst = (char *) malloc(size);

        for (size_t i = 0; i < size; i++) src[i] = i;

        memcpy(dst, src, size); // heat-up

        double tsum = 0.0;

        auto helper = [&](int th) {
            const int64_t i0 = (th + 0)*size/k;
            const int64_t i1 = (th + 1)*size/k;

            for (size_t i = 0; i < n; i++) {
                memcpy(dst + i0, src + i0, i1 - i0);

                src[i0 + rand() % (i1 - i0)] = rand() % 256;
            };
        };

        const int64_t t0 = ggml_time_us();

        std::vector<std::thread> threads(k - 1);
        for (int32_t th = 0; th < k - 1; ++th) {
            threads[th] = std::thread(helper, th);
        }

        helper(k - 1);

        for (int32_t th = 0; th < k - 1; ++th) {
            threads[th].join();
        }

        const int64_t t1 = ggml_time_us();

        tsum += (t1 - t0)*1e-6;

        snprintf(strbuf, sizeof(strbuf), "memcpy: %7.2f GB/s (%2d thread)\n", (double) (n*size)/(tsum*1e9), k);
        s += strbuf;

        // needed to prevent the compiler from optimizing the memcpy away
        {
            for (size_t i = 0; i < size; i++) sum += dst[i];
        }

        free(src);
        free(dst);
    }

    snprintf(strbuf, sizeof(strbuf), "sum:    %f\n", sum);
    s += strbuf;

    return s.c_str();
}